

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_ddos_log.cc
# Opt level: O3

int __thiscall
aliyun::Yundun::DdosLog
          (Yundun *this,YundunDdosLogRequestType *req,YundunDdosLogResponseType *response,
          YundunErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_4f0;
  YundunDdosLogResponseType *local_4d8;
  string local_4d0;
  Value *local_4b0;
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  Int local_448;
  long local_440;
  long local_438;
  long local_430;
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  Int local_3e8;
  long *local_3e0;
  long local_3d8;
  long local_3d0 [2];
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  local_3c0._M_string_length = 0;
  local_3c0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_3e0 = local_3d0;
  local_4d8 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_4f0);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_3e0,local_3d8 + (long)local_3e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_3a0.field_2._M_allocated_capacity = *psVar12;
    local_3a0.field_2._8_8_ = plVar8[3];
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  }
  else {
    local_3a0.field_2._M_allocated_capacity = *psVar12;
    local_3a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_3a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_4f0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DdosLog","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->jst_owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"JstOwnerId","");
    pcVar2 = (req->jst_owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->jst_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"PageNumber","");
    pcVar2 = (req->page_number)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"InstanceId","");
    pcVar2 = (req->instance_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_type)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"InstanceType","");
    pcVar2 = (req->instance_type)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->instance_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_4a8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_3c0);
    if (((0 < iVar4) && (local_3c0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_3c0,&local_4f0,true), bVar3)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_4f0,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
        }
        else {
          local_4a8._0_8_ = local_4a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_4a8);
        pcVar2 = local_4a8 + 0x10;
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4f0,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4f0,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_4f0,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
        }
        else {
          local_4a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_4a8);
        if ((pointer)local_4a8._0_8_ != pcVar2) {
          operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
        }
      }
      if (local_4d8 != (YundunDdosLogResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_4f0,"AttackStatus");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"AttackStatus");
          IVar5 = Json::Value::asInt(pVVar10);
          local_4d8->attack_status = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4f0,"StartTime");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"StartTime");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
          std::__cxx11::string::operator=((string *)&local_4d8->start_time,(string *)local_4a8);
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4f0,"EndTime");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"EndTime");
          Json::Value::asString_abi_cxx11_((string *)local_4a8,pVVar10);
          std::__cxx11::string::operator=((string *)&local_4d8->end_time,(string *)local_4a8);
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_,CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_4f0,"PageNumber");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"PageNumber");
          IVar5 = Json::Value::asInt(pVVar10);
          local_4d8->page_number = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4f0,"PageSize");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"PageSize");
          IVar5 = Json::Value::asInt(pVVar10);
          local_4d8->page_size = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4f0,"TotalCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"TotalCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_4d8->total_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_4f0,"LogList");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_4f0,"LogList");
          bVar3 = Json::Value::isMember(pVVar10,"DdosLog");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_4f0,"LogList");
            pVVar10 = Json::Value::operator[](pVVar10,"DdosLog");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              index = 0;
              local_4b0 = pVVar10;
              do {
                local_4a8._8_8_ = 0;
                local_4a8[0x10] = '\0';
                local_488._M_p = (pointer)&local_478;
                local_480 = 0;
                local_478._M_local_buf[0] = '\0';
                local_468._M_p = (pointer)&local_458;
                local_460 = 0;
                local_458._M_local_buf[0] = '\0';
                local_428._M_p = (pointer)&local_418;
                local_420 = 0;
                local_418._M_local_buf[0] = '\0';
                local_408._M_p = (pointer)&local_3f8;
                local_400 = 0;
                local_3f8._M_local_buf[0] = '\0';
                local_4a8._0_8_ = local_4a8 + 0x10;
                pVVar10 = Json::Value::operator[](local_4b0,index);
                bVar3 = Json::Value::isMember(pVVar10,"StartTime");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"StartTime");
                  Json::Value::asString_abi_cxx11_(&local_4d0,pVVar11);
                  std::__cxx11::string::operator=((string *)local_4a8,(string *)&local_4d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"EndTime");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"EndTime");
                  Json::Value::asString_abi_cxx11_(&local_4d0,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_488,(string *)&local_4d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Reason");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Reason");
                  Json::Value::asString_abi_cxx11_(&local_4d0,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_468,(string *)&local_4d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Status");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Status");
                  local_448 = Json::Value::asInt(pVVar11);
                }
                bVar3 = Json::Value::isMember(pVVar10,"Bps");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Bps");
                  IVar5 = Json::Value::asInt(pVVar11);
                  local_440 = (long)IVar5;
                }
                bVar3 = Json::Value::isMember(pVVar10,"Pps");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Pps");
                  IVar5 = Json::Value::asInt(pVVar11);
                  local_438 = (long)IVar5;
                }
                bVar3 = Json::Value::isMember(pVVar10,"Qps");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Qps");
                  IVar5 = Json::Value::asInt(pVVar11);
                  local_430 = (long)IVar5;
                }
                bVar3 = Json::Value::isMember(pVVar10,"AttackType");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"AttackType");
                  Json::Value::asString_abi_cxx11_(&local_4d0,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_428,(string *)&local_4d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"AttackIpList");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"AttackIpList");
                  Json::Value::asString_abi_cxx11_(&local_4d0,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_408,(string *)&local_4d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Type");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar10,"Type");
                  local_3e8 = Json::Value::asInt(pVVar10);
                }
                std::
                vector<aliyun::YundunDdosLogDdosLogType,_std::allocator<aliyun::YundunDdosLogDdosLogType>_>
                ::push_back(&local_4d8->log_list,(value_type *)local_4a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_p != &local_3f8) {
                  operator_delete(local_408._M_p,
                                  CONCAT71(local_3f8._M_allocated_capacity._1_7_,
                                           local_3f8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_p != &local_418) {
                  operator_delete(local_428._M_p,
                                  CONCAT71(local_418._M_allocated_capacity._1_7_,
                                           local_418._M_local_buf[0]) + 1);
                }
                pVVar10 = local_4b0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_p != &local_458) {
                  operator_delete(local_468._M_p,
                                  CONCAT71(local_458._M_allocated_capacity._1_7_,
                                           local_458._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_488._M_p != &local_478) {
                  operator_delete(local_488._M_p,
                                  CONCAT71(local_478._M_allocated_capacity._1_7_,
                                           local_478._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
                  operator_delete((void *)local_4a8._0_8_,
                                  CONCAT71(local_4a8._17_7_,local_4a8[0x10]) + 1);
                }
                AVar6 = Json::Value::size(pVVar10);
                index = index + 1;
              } while (index < AVar6);
            }
          }
        }
      }
      goto LAB_00130ffd;
    }
    if (error_info == (YundunErrorInfo *)0x0) goto LAB_00130ff8;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (YundunErrorInfo *)0x0) {
LAB_00130ff8:
      iVar4 = -1;
      goto LAB_00130ffd;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_00130ffd:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_4f0);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0,local_3d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Yundun::DdosLog(const YundunDdosLogRequestType& req,
                      YundunDdosLogResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DdosLog");
  if(!req.jst_owner_id.empty()) {
    req_rpc->AddRequestQuery("JstOwnerId", req.jst_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.instance_id.empty()) {
    req_rpc->AddRequestQuery("InstanceId", req.instance_id);
  }
  if(!req.instance_type.empty()) {
    req_rpc->AddRequestQuery("InstanceType", req.instance_type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}